

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O1

int mmdelm_(int *mdnode,int *xadj,int *adjncy,int *dhead,int *dforw,int *dbakw,int *qsize,int *llist
           ,int *marker,int *maxint,int *tag)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  marker[(long)*mdnode + -1] = *tag;
  iVar5 = xadj[(long)*mdnode + -1];
  iVar10 = xadj[*mdnode];
  uVar3 = 0;
  iVar11 = iVar10 - iVar5;
  if (iVar5 < iVar10) {
    lVar4 = (long)iVar5;
    lVar9 = 0;
    uVar3 = 0;
    uVar8 = 0;
    do {
      uVar1 = adjncy[lVar4 + lVar9 + -1];
      lVar7 = (long)(int)uVar1;
      if (lVar7 == 0) break;
      if (marker[lVar7 + -1] < *tag) {
        marker[lVar7 + -1] = *tag;
        if (dforw[lVar7 + -1] < 0) {
          llist[lVar7 + -1] = uVar8;
          uVar8 = uVar1;
          uVar3 = uVar1;
        }
        else {
          adjncy[(long)iVar5 + -1] = uVar1;
          iVar5 = iVar5 + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (iVar11 != (int)lVar9);
  }
  iVar10 = iVar10 + -1;
  for (; 0 < (int)uVar3; uVar3 = llist[(ulong)uVar3 - 1]) {
    adjncy[(long)iVar10 + -1] = -uVar3;
    iVar6 = xadj[uVar3];
    for (iVar11 = xadj[(ulong)uVar3 - 1]; iVar11 < iVar6; iVar11 = xadj[(ulong)(uint)-iVar11 - 1]) {
      lVar4 = (long)iVar11;
      while( true ) {
        iVar11 = adjncy[lVar4 + -1];
        lVar9 = (long)iVar11;
        if (lVar9 < 0) break;
        if (iVar11 == 0) goto LAB_001437a2;
        if ((marker[lVar9 + -1] < *tag) && (-1 < dforw[lVar9 + -1])) {
          marker[lVar9 + -1] = *tag;
          for (; iVar10 <= iVar5; iVar10 = xadj[(long)(1 - adjncy[(long)iVar10 + -1]) + -1] + -1) {
            iVar5 = xadj[-1 - (long)adjncy[(long)iVar10 + -1]];
          }
          adjncy[(long)iVar5 + -1] = iVar11;
          iVar5 = iVar5 + 1;
        }
        lVar4 = lVar4 + 1;
        if (iVar6 <= lVar4) goto LAB_001437a2;
      }
      iVar6 = xadj[(uint)-iVar11];
    }
LAB_001437a2:
  }
  if (iVar5 <= iVar10) {
    adjncy[(long)iVar5 + -1] = 0;
  }
  iVar5 = xadj[(long)*mdnode + -1];
  iVar10 = xadj[*mdnode];
  if (iVar5 < iVar10) {
    do {
      lVar4 = (long)iVar5;
      while( true ) {
        iVar11 = adjncy[lVar4 + -1];
        lVar9 = (long)iVar11;
        if (lVar9 < 0) break;
        if (iVar11 == 0) {
          return 0;
        }
        uVar3 = dbakw[lVar9 + -1];
        if (((ulong)uVar3 != 0) && (*maxint + uVar3 != 0)) {
          iVar5 = dforw[lVar9 + -1];
          if (0 < (long)iVar5) {
            dbakw[(long)iVar5 + -1] = uVar3;
          }
          if (0 < (int)uVar3) {
            dforw[(ulong)uVar3 - 1] = iVar5;
          }
          if ((int)uVar3 < 0) {
            dhead[(ulong)-uVar3 - 1] = iVar5;
          }
        }
        iVar5 = xadj[lVar9 + -1];
        iVar11 = xadj[lVar9];
        iVar6 = iVar5;
        if (iVar5 < iVar11) {
          lVar7 = 0;
          do {
            iVar2 = adjncy[(long)iVar5 + lVar7 + -1];
            if ((long)iVar2 == 0) break;
            if (marker[(long)iVar2 + -1] < *tag) {
              adjncy[(long)iVar6 + -1] = iVar2;
              iVar6 = iVar6 + 1;
            }
            lVar7 = lVar7 + 1;
          } while (iVar11 - iVar5 != (int)lVar7);
        }
        if (iVar6 - iVar5 == 0 || iVar6 < iVar5) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar9 + -1];
          qsize[lVar9 + -1] = 0;
          marker[lVar9 + -1] = *maxint;
          dforw[lVar9 + -1] = -*mdnode;
          dbakw[lVar9 + -1] = -*maxint;
        }
        else {
          dforw[lVar9 + -1] = (iVar6 - iVar5) + 1;
          dbakw[lVar9 + -1] = 0;
          adjncy[(long)iVar6 + -1] = *mdnode;
          if (iVar6 < iVar11 + -1) {
            adjncy[iVar6] = 0;
          }
        }
        lVar4 = lVar4 + 1;
        if (iVar10 <= lVar4) {
          return 0;
        }
      }
      iVar5 = xadj[(ulong)(uint)-iVar11 - 1];
      iVar10 = xadj[(uint)-iVar11];
    } while (iVar5 < iVar10);
  }
  return 0;
}

Assistant:

int mmdelm_(int* mdnode, int* xadj, int* adjncy, int* dhead, int* dforw,
            int* dbakw, int* qsize, int* llist, int* marker,
            int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr,
            istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L300;
        }
        if (marker[nabor] >= *tag) {
            goto L200;
        }
        marker[nabor] = *tag;
        if (dforw[nabor] < 0) {
            goto L100;
        }
        adjncy[rloc] = nabor;
        ++rloc;
        goto L200;
L100:
        llist[nabor] = elmnt;
        elmnt = nabor;
L200:
        ;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
        goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
        node = adjncy[j];
        link = -node;
        if (node < 0) {
            goto L400;
        } else if (node == 0) {
            goto L900;
        } else {
            goto L500;
        }
L500:
        if (marker[node] >= *tag || dforw[node] < 0) {
            goto L800;
        }
        marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
        if (rloc < rlmt) {
            goto L700;
        }
        link = -adjncy[rlmt];
        rloc = xadj[link];
        rlmt = xadj[link + 1] - 1;
        goto L600;
L700:
        adjncy[rloc] = node;
        ++rloc;
L800:
        ;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
        adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        rnode = adjncy[i];
        link = -rnode;
        if (rnode < 0) {
            goto L1100;
        } else if (rnode == 0) {
            goto L1800;
        } else {
            goto L1200;
        }
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
        pvnode = dbakw[rnode];
        if (pvnode == 0 || pvnode == -(*maxint)) {
            goto L1300;
        }
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
        nxnode = dforw[rnode];
        if (nxnode > 0) {
            dbakw[nxnode] = pvnode;
        }
        if (pvnode > 0) {
            dforw[pvnode] = nxnode;
        }
        npv = -pvnode;
        if (pvnode < 0) {
            dhead[npv] = nxnode;
        }
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
        jstrt = xadj[rnode];
        jstop = xadj[rnode + 1] - 1;
        xqnbr = jstrt;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            nabor = adjncy[j];
            if (nabor == 0) {
                goto L1500;
            }
            if (marker[nabor] >= *tag) {
                goto L1400;
            }
            adjncy[xqnbr] = nabor;
            ++xqnbr;
L1400:
            ;
        }
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
        nqnbrs = xqnbr - jstrt;
        if (nqnbrs > 0) {
            goto L1600;
        }
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
        qsize[*mdnode] += qsize[rnode];
        qsize[rnode] = 0;
        marker[rnode] = *maxint;
        dforw[rnode] = -(*mdnode);
        dbakw[rnode] = -(*maxint);
        goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
        dforw[rnode] = nqnbrs + 1;
        dbakw[rnode] = 0;
        adjncy[xqnbr] = *mdnode;
        ++xqnbr;
        if (xqnbr <= jstop) {
            adjncy[xqnbr] = 0;
        }

L1700:
        ;
    }
L1800:
    return 0;

}